

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

class_<OmegaSN> * __thiscall
pybind11::class_<OmegaSN>::def<double(OmegaSN::*)()const>
          (class_<OmegaSN> *this,char *name_,offset_in_OmegaOP_to_subr *f)

{
  offset_in_OmegaOP_to_subr f_00;
  name *extra;
  handle obj;
  handle key;
  cpp_function cf;
  handle local_70;
  handle local_68;
  handle local_60;
  object local_58;
  handle local_50;
  is_method local_48;
  PyObject *local_40;
  object local_38;
  object local_30;
  
  f_00 = *f;
  extra = (name *)f[1];
  local_50.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  local_58.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_48.class_.m_ptr = (handle)(handle)name_;
  local_60.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_60.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_60.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_70.m_ptr = local_60.m_ptr;
  cpp_function::cpp_function<double,OmegaSN,,pybind11::name,pybind11::is_method,pybind11::sibling>
            ((cpp_function *)&local_68,f_00,extra,&local_48,(sibling *)&local_50);
  object::~object((object *)&local_60);
  object::~object(&local_58);
  cpp_function::name((cpp_function *)&local_70);
  key.m_ptr = local_70.m_ptr;
  obj.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  if (local_70.m_ptr != (PyObject *)0x0) {
    (local_70.m_ptr)->ob_refcnt = (local_70.m_ptr)->ob_refcnt + 1;
  }
  local_38.super_handle.m_ptr = (handle)(handle)local_70.m_ptr;
  local_50.m_ptr = (PyObject *)0x0;
  local_30.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_40 = obj.m_ptr;
  object::~object((object *)&local_50);
  detail::accessor_policies::obj_attr::set(obj,key,local_68);
  object::~object(&local_30);
  object::~object(&local_38);
  object::~object((object *)&local_70);
  object::~object((object *)&local_68);
  return this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }